

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilCountPairsAllPrint(Sym_Man_t *p)

{
  abctime aVar1;
  Extra_BitMat_t *pMat;
  Vec_Int_t *vSupport;
  abctime aVar2;
  abctime clk;
  int i;
  Sym_Man_t *p_local;
  
  aVar1 = Abc_Clock();
  for (clk._4_4_ = 0; (int)clk._4_4_ < p->nOutputs; clk._4_4_ = clk._4_4_ + 1) {
    printf("Output %2d :",(ulong)clk._4_4_);
    pMat = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,clk._4_4_);
    vSupport = Vec_VecEntryInt(p->vSupports,clk._4_4_);
    Sim_UtilCountPairsOnePrint(pMat,vSupport);
    printf("\n");
  }
  aVar2 = Abc_Clock();
  p->timeCount = (aVar2 - aVar1) + p->timeCount;
  return;
}

Assistant:

void Sim_UtilCountPairsAllPrint( Sym_Man_t * p )
{
    int i;
    abctime clk;
clk = Abc_Clock();
    for ( i = 0; i < p->nOutputs; i++ )
    {
        printf( "Output %2d :", i );
        Sim_UtilCountPairsOnePrint( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms, i), Vec_VecEntryInt(p->vSupports, i) );
        printf( "\n" );
    }
p->timeCount += Abc_Clock() - clk;
}